

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

color_quad_i16 __thiscall crnlib::etc1_block::unpack_delta3(etc1_block *this,uint16 packed_delta3)

{
  undefined4 local_20;
  undefined4 local_1c;
  int b;
  int g;
  int r;
  uint16 packed_delta3_local;
  
  b = (int)(uint)packed_delta3 >> 6 & 7;
  local_1c = (int)(uint)packed_delta3 >> 3 & 7;
  local_20 = packed_delta3 & 7;
  if (3 < (uint)b) {
    b = b - 8;
  }
  if (3 < local_1c) {
    local_1c = local_1c - 8;
  }
  if (3 < local_20) {
    local_20 = local_20 - 8;
  }
  color_quad<short,_int>::color_quad((color_quad<short,_int> *)this,b,local_1c,local_20,0);
  return (color_quad_i16)(anon_union_8_3_dd316fa8_for_color_quad<short,_int>_3)this;
}

Assistant:

color_quad_i16 etc1_block::unpack_delta3(uint16 packed_delta3)
    {
        int r = (packed_delta3 >> 6) & 7;
        int g = (packed_delta3 >> 3) & 7;
        int b = packed_delta3 & 7;
        if (r >= 4)
        {
            r -= 8;
        }
        if (g >= 4)
        {
            g -= 8;
        }
        if (b >= 4)
        {
            b -= 8;
        }
        return color_quad_i16(r, g, b, 0);
    }